

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

Vector<float,_4> tcu::sampleTextureBorder<float>(TextureFormat *format,Sampler *sampler)

{
  TextureChannelClass TVar1;
  Vector<float,_4> *res;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 in_XMM1_Qa;
  undefined1 auVar6 [16];
  Vec4 VVar7;
  Vector<float,_4> VVar8;
  TextureFormat local_38;
  uint uStack_30;
  uint uStack_2c;
  
  auVar6._0_8_ = in_XMM1_Qa;
  TVar1 = getTextureChannelClass(sampler->wrapT);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    VVar7 = getTextureBorderColorFloat(format,(Sampler *)(ulong)sampler->wrapS);
    auVar6._0_8_ = VVar7.m_data._8_8_;
    fVar2 = VVar7.m_data[0];
    fVar3 = VVar7.m_data[1];
    goto LAB_001f1e5e;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    getTextureBorderColorInt(&local_38,(Sampler *)(ulong)sampler->wrapS);
    format->order = R;
    format->type = SNORM_INT8;
    format[1].order = R;
    format[1].type = SNORM_INT8;
    fVar2 = (float)(int)local_38.order;
    fVar3 = (float)(int)local_38.type;
    fVar4 = (float)(int)uStack_30;
    fVar5 = (float)(int)uStack_2c;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    getTextureBorderColorUint(&local_38,(Sampler *)(ulong)sampler->wrapS);
    fVar2 = 0.0;
    fVar3 = 0.0;
    format->order = R;
    format->type = SNORM_INT8;
    format[1].order = R;
    format[1].type = SNORM_INT8;
    auVar6._0_8_ = CONCAT44(((float)(local_38.type >> 0x10 | 0x53000000) - 5.497642e+11) +
                            (float)(local_38.type & 0xffff | 0x4b000000),
                            ((float)(local_38.order >> 0x10 | 0x53000000) - 5.497642e+11) +
                            (float)(local_38.order & 0xffff | 0x4b000000));
    auVar6._8_4_ = ((float)(uStack_30 >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(uStack_30 & 0xffff | 0x4b000000);
    auVar6._12_4_ =
         ((float)(uStack_2c >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_2c & 0xffff | 0x4b000000);
    *(undefined1 (*) [16])format = auVar6;
    goto LAB_001f1e5e;
  default:
    fVar2 = 0.0;
    fVar3 = 0.0;
    fVar4 = 0.0;
    fVar5 = 0.0;
  }
  format->order = (ChannelOrder)fVar2;
  format->type = (ChannelType)fVar3;
  format[1].order = (ChannelOrder)fVar4;
  format[1].type = (ChannelType)fVar5;
LAB_001f1e5e:
  VVar8.m_data[1] = fVar3;
  VVar8.m_data[0] = fVar2;
  VVar8.m_data[2] = (float)(int)auVar6._0_8_;
  VVar8.m_data[3] = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
  return (Vector<float,_4>)VVar8.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}